

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
initiatorCreatedBeforeStartTimeFixture::initiatorCreatedBeforeStartTimeFixture
          (initiatorCreatedBeforeStartTimeFixture *this)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  BeginString *beginString_00;
  Session *pSVar1;
  UtcTimeOnly *pUVar2;
  anon_class_8_1_8991fb9c local_838;
  function<FIX::UtcTimeStamp_()> local_830;
  allocator<char> local_809;
  string local_808;
  string local_7e8;
  undefined1 local_7c8 [8];
  DataDictionaryProvider provider;
  string local_380;
  allocator<char> local_359;
  STRING local_358;
  StringField local_338;
  allocator<char> local_2d9;
  STRING local_2d8;
  StringField local_2b8;
  allocator<char> local_259;
  STRING local_258;
  StringField local_238;
  undefined1 local_1e0 [8];
  SessionID sessionID;
  TimeRange sessionTime;
  UtcTimeOnly local_50;
  UtcTimeOnly local_38;
  initiatorCreatedBeforeStartTimeFixture *local_10;
  initiatorCreatedBeforeStartTimeFixture *this_local;
  
  local_10 = this;
  anon_unknown.dwarf_2926b4::TestCallback::TestCallback(&this->super_TestCallback);
  (this->super_TestCallback).super_Responder._vptr_Responder =
       (_func_int **)&PTR__initiatorCreatedBeforeStartTimeFixture_0050b310;
  (this->super_TestCallback).super_NullApplication.super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorCreatedBeforeStartTimeFixture_0050b360;
  this->actuallySent = 0;
  this->actuallySentLogon = false;
  FIX::MemoryStoreFactory::MemoryStoreFactory(&this->messageStoreFactory);
  FIX::UtcTimeStamp::setCurrent(&(this->super_TestCallback).now);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_38,&(this->super_TestCallback).now.super_DateTime);
  pUVar2 = &(this->super_TestCallback).startTime;
  FIX::UtcTimeOnly::operator=(pUVar2,&local_38);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_38);
  FIX::DateTime::setMillisecond(&pUVar2->super_DateTime,0);
  FIX::DateTime::operator+=(&(this->super_TestCallback).startTime.super_DateTime,2);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_50,&(this->super_TestCallback).now.super_DateTime);
  pUVar2 = &(this->super_TestCallback).endTime;
  FIX::UtcTimeOnly::operator=(pUVar2,&local_50);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_50);
  FIX::DateTime::setMillisecond(&pUVar2->super_DateTime,0);
  pUVar2 = &(this->super_TestCallback).endTime;
  FIX::DateTime::operator+=(&pUVar2->super_DateTime,4);
  FIX::TimeRange::TimeRange
            ((TimeRange *)(sessionID.m_frozenString.field_2._M_local_buf + 8),
             &(this->super_TestCallback).startTime,pUVar2,-1,-1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"FIX.4.2",&local_259);
  FIX::BeginString::BeginString((BeginString *)&local_238,&local_258);
  beginString = FIX::StringField::operator_cast_to_string_(&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"MJKG",&local_2d9);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_2b8,&local_2d8);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"IZZY",&local_359);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_338,&local_358);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"",(allocator<char> *)&provider.field_0x43f);
  FIX::SessionID::SessionID((SessionID *)local_1e0,beginString,senderCompID,targetCompID,&local_380)
  ;
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&provider.field_0x43f);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  FIX::BeginString::~BeginString((BeginString *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_7c8);
  beginString_00 = FIX::SessionID::getBeginString((SessionID *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"FIX42",&local_809);
  FIX::TestSettings::pathForSpec(&local_7e8,&local_808);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)local_7c8,beginString_00,&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  pSVar1 = (Session *)operator_new(0x878);
  local_838.this = this;
  std::function<FIX::UtcTimeStamp()>::
  function<initiatorCreatedBeforeStartTimeFixture::initiatorCreatedBeforeStartTimeFixture()::_lambda()_1_,void>
            ((function<FIX::UtcTimeStamp()> *)&local_830,&local_838);
  FIX::Session::Session
            (pSVar1,&local_830,&(this->super_TestCallback).super_NullApplication,
             &this->messageStoreFactory,local_1e0,local_7c8,
             (undefined1 *)((long)&sessionID.m_frozenString.field_2 + 8),0x1e,0);
  this->object = pSVar1;
  std::function<FIX::UtcTimeStamp_()>::~function(&local_830);
  FIX::DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_7c8);
  FIX::SessionID::~SessionID((SessionID *)local_1e0);
  FIX::TimeRange::~TimeRange((TimeRange *)(sessionID.m_frozenString.field_2._M_local_buf + 8));
  return;
}

Assistant:

initiatorCreatedBeforeStartTimeFixture()
      : actuallySent(0),
        actuallySentLogon(false) {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);
    startTime += STARTTIMEFROMNOW;
    endTime = now;
    endTime.setMillisecond(0);
    endTime += ENDTIMEFROMNOW;
    TimeRange sessionTime(startTime, endTime);

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("MJKG"), TargetCompID("IZZY"));

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIX42"));
    object = new Session(
        [this]() { return now; },
        *this,
        messageStoreFactory,
        sessionID,
        provider,
        sessionTime,
        HEARTBTINT,
        0);
  }